

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gd_mf.cc
# Opt level: O3

void mf_print_offset_features(gdmf *d,example *ec,size_t offset)

{
  unsigned_long *puVar1;
  undefined8 *puVar2;
  long lVar3;
  ulong uVar4;
  _func_void_weight_ptr_void_ptr *p_Var5;
  byte *pbVar6;
  float *pfVar7;
  element_type *peVar8;
  _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_float_*>,_std::allocator<std::pair<const_unsigned_long,_float_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  *p_Var9;
  uint uVar10;
  shared_ptr<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *psVar11;
  ostream *poVar12;
  _Node_iterator_base<std::pair<const_unsigned_long,_float_*>,_false> _Var13;
  weight *pwVar14;
  vw_exception *this;
  byte bVar15;
  uint64_t *puVar16;
  long lVar17;
  pointer pbVar18;
  _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_float_*>,_std::allocator<std::pair<const_unsigned_long,_float_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  *p_Var19;
  _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_float_*>,_std::allocator<std::pair<const_unsigned_long,_float_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  *p_Var20;
  vw *pvVar21;
  bool bVar22;
  weight wVar23;
  uint64_t index;
  stringstream __msg;
  ulong local_280;
  _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_float_*>,_std::allocator<std::pair<const_unsigned_long,_float_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  *local_278;
  features *local_270;
  unsigned_long *local_268;
  _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_float_*>,_std::allocator<std::pair<const_unsigned_long,_float_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  *local_260;
  _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_float_*>,_std::allocator<std::pair<const_unsigned_long,_float_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  *local_258;
  shared_ptr<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_250;
  shared_ptr<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_248;
  gdmf *local_240;
  size_t local_238;
  shared_ptr<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_230;
  vw *local_228;
  shared_ptr<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_220;
  uint64_t local_218;
  weight local_20c;
  pointer local_208;
  pointer local_200;
  shared_ptr<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_1f8;
  shared_ptr<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_1f0;
  float *local_1e8;
  float *local_1e0;
  ulong local_1d8;
  float *local_1d0;
  ostream local_1c8;
  string local_50;
  
  pvVar21 = d->all;
  puVar16 = &(pvVar21->weights).dense_weights._weight_mask;
  if ((pvVar21->weights).sparse != false) {
    puVar16 = &(pvVar21->weights).sparse_weights._weight_mask;
  }
  local_218 = *puVar16;
  local_270 = (ec->super_example_predict).feature_space;
  psVar11 = (shared_ptr<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)(ec->super_example_predict).indices._begin;
  local_230 = (shared_ptr<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(ec->super_example_predict).indices._end;
  local_240 = d;
  local_238 = offset;
  local_228 = pvVar21;
  if (psVar11 != local_230) {
    local_258 = (_Hashtable<unsigned_long,_std::pair<const_unsigned_long,_float_*>,_std::allocator<std::pair<const_unsigned_long,_float_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                 *)&(pvVar21->weights).sparse_weights;
    do {
      bVar15 = *(byte *)&(psVar11->
                         super___shared_ptr<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_(__gnu_cxx::_Lock_policy)2>
                         )._M_ptr;
      local_260 = (_Hashtable<unsigned_long,_std::pair<const_unsigned_long,_float_*>,_std::allocator<std::pair<const_unsigned_long,_float_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                   *)local_270[bVar15].values._begin;
      local_278 = (_Hashtable<unsigned_long,_std::pair<const_unsigned_long,_float_*>,_std::allocator<std::pair<const_unsigned_long,_float_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                   *)local_270[bVar15].values._end;
      local_250 = psVar11;
      if (local_260 != local_278) {
        local_248 = local_270[bVar15].space_names._begin;
        local_220 = local_270[bVar15].space_names._end;
        local_268 = local_270[bVar15].indicies._begin;
        lVar17 = 0;
        do {
          psVar11 = local_248;
          local_1d8._0_1_ = (stringstream)0x9;
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,(char *)&local_1d8,1);
          if (psVar11 != local_220) {
            puVar2 = *(undefined8 **)
                      ((long)&(psVar11->
                              super___shared_ptr<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_(__gnu_cxx::_Lock_policy)2>
                              )._M_ptr + lVar17 * 4);
            poVar12 = std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)&std::cout,(char *)*puVar2,puVar2[1]);
            local_1d8._0_1_ = (stringstream)0x5e;
            poVar12 = std::__ostream_insert<char,std::char_traits<char>>
                                (poVar12,(char *)&local_1d8,1);
            lVar3 = *(long *)((long)&(psVar11->
                                     super___shared_ptr<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_(__gnu_cxx::_Lock_policy)2>
                                     )._M_ptr + lVar17 * 4);
            poVar12 = std::__ostream_insert<char,std::char_traits<char>>
                                (poVar12,*(char **)(lVar3 + 0x20),*(long *)(lVar3 + 0x28));
            local_1d8._0_1_ = (stringstream)0x3a;
            std::__ostream_insert<char,std::char_traits<char>>(poVar12,(char *)&local_1d8,1);
          }
          puVar1 = local_268;
          poVar12 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
          std::__ostream_insert<char,std::char_traits<char>>(poVar12,"(",1);
          poVar12 = std::ostream::_M_insert<unsigned_long>((ulong)poVar12);
          std::__ostream_insert<char,std::char_traits<char>>(poVar12,")",1);
          local_1d8._0_1_ = (stringstream)0x3a;
          std::__ostream_insert<char,std::char_traits<char>>(poVar12,(char *)&local_1d8,1);
          std::ostream::_M_insert<double>((double)*(float *)((long)&local_260->_M_buckets + lVar17))
          ;
          local_1d8 = CONCAT71(local_1d8._1_7_,0x3a);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,(char *)&local_1d8,1);
          pvVar21 = local_228;
          uVar4 = *(ulong *)((long)puVar1 + lVar17 * 2);
          if ((local_228->weights).sparse == true) {
            local_280 = uVar4 & (local_228->weights).sparse_weights._weight_mask;
            _Var13._M_cur =
                 (__node_type *)
                 std::
                 _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_float_*>,_std::allocator<std::pair<const_unsigned_long,_float_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                 ::find(local_258,&local_280);
            if (_Var13._M_cur == (__node_type *)0x0) {
              local_1d0 = calloc_or_throw<float>
                                    (1L << ((byte)(pvVar21->weights).sparse_weights._stride_shift &
                                           0x3f));
              p_Var19 = local_258;
              local_1d8 = local_280;
              std::
              _Hashtable<unsigned_long,std::pair<unsigned_long_const,float*>,std::allocator<std::pair<unsigned_long_const,float*>>,std::__detail::_Select1st,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
              ::_M_emplace<std::pair<unsigned_long,float*>>
                        ((_Hashtable<unsigned_long,std::pair<unsigned_long_const,float*>,std::allocator<std::pair<unsigned_long_const,float*>>,std::__detail::_Select1st,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                          *)local_258,&local_1d8);
              _Var13._M_cur =
                   (__node_type *)
                   std::
                   _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_float_*>,_std::allocator<std::pair<const_unsigned_long,_float_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                   ::find(p_Var19,&local_280);
              p_Var5 = (pvVar21->weights).sparse_weights.fun;
              if (p_Var5 != (_func_void_weight_ptr_void_ptr *)0x0) {
                (*p_Var5)(*(weight **)((long)_Var13._M_cur + 0x10),
                          (pvVar21->weights).sparse_weights.default_data);
              }
            }
            pwVar14 = *(weight **)
                       ((long)&((_Var13._M_cur)->
                               super__Hash_node_value<std::pair<const_unsigned_long,_float_*>,_false>
                               ).
                               super__Hash_node_value_base<std::pair<const_unsigned_long,_float_*>_>
                               ._M_storage._M_storage + 8);
          }
          else {
            pwVar14 = (local_228->weights).dense_weights._begin +
                      (uVar4 & (local_228->weights).dense_weights._weight_mask);
          }
          offset = local_238;
          std::ostream::_M_insert<double>((double)pwVar14[local_238]);
          lVar3 = lVar17 + 4;
          lVar17 = lVar17 + 4;
        } while ((_Hashtable<unsigned_long,_std::pair<const_unsigned_long,_float_*>,_std::allocator<std::pair<const_unsigned_long,_float_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                  *)((long)&local_260->_M_buckets + lVar3) != local_278);
      }
      psVar11 = (shared_ptr<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)((long)&(local_250->
                           super___shared_ptr<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_(__gnu_cxx::_Lock_policy)2>
                           )._M_ptr + 1);
    } while (psVar11 != local_230);
  }
  pbVar18 = (pvVar21->pairs).
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  local_208 = (pvVar21->pairs).
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish;
  if (pbVar18 != local_208) {
    local_278 = (_Hashtable<unsigned_long,_std::pair<const_unsigned_long,_float_*>,_std::allocator<std::pair<const_unsigned_long,_float_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                 *)&(pvVar21->weights).sparse_weights;
    do {
      pbVar6 = (byte *)(pbVar18->_M_dataplus)._M_p;
      bVar15 = *pbVar6;
      if (local_270[bVar15].values._end != local_270[bVar15].values._begin) {
        bVar15 = pbVar6[1];
        uVar10 = local_240->rank;
        if (uVar10 != 0 && local_270[bVar15].values._end != local_270[bVar15].values._begin) {
          local_268 = (unsigned_long *)0x1;
          local_200 = pbVar18;
          do {
            bVar15 = *(pbVar18->_M_dataplus)._M_p;
            local_250 = (shared_ptr<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)local_270[bVar15].values._begin;
            local_1f8 = (shared_ptr<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)local_270[bVar15].values._end;
            if (local_250 != local_1f8) {
              local_248 = (shared_ptr<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)local_270[bVar15].indicies._begin;
              local_230 = local_270[bVar15].space_names._begin;
              local_258 = (_Hashtable<unsigned_long,_std::pair<const_unsigned_long,_float_*>,_std::allocator<std::pair<const_unsigned_long,_float_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                           *)((long)local_268 + offset);
              do {
                bVar15 = (pbVar18->_M_dataplus)._M_p[1];
                pfVar7 = local_270[bVar15].values._begin;
                local_1e0 = local_270[bVar15].values._end;
                if (pfVar7 != local_1e0) {
                  local_220 = (shared_ptr<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               *)local_270[bVar15].indicies._begin;
                  local_1f0 = local_270[bVar15].space_names._begin;
                  p_Var19 = (_Hashtable<unsigned_long,_std::pair<const_unsigned_long,_float_*>,_std::allocator<std::pair<const_unsigned_long,_float_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                             *)0x0;
                  local_1e8 = pfVar7;
                  do {
                    local_1d8._0_1_ = (stringstream)0x9;
                    local_260 = p_Var19;
                    poVar12 = std::__ostream_insert<char,std::char_traits<char>>
                                        ((ostream *)&std::cout,(char *)&local_1d8,1);
                    psVar11 = local_230;
                    peVar8 = (local_230->
                             super___shared_ptr<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_(__gnu_cxx::_Lock_policy)2>
                             )._M_ptr;
                    poVar12 = std::__ostream_insert<char,std::char_traits<char>>
                                        (poVar12,(peVar8->first)._M_dataplus._M_p,
                                         (peVar8->first)._M_string_length);
                    poVar12 = std::ostream::_M_insert<unsigned_long>((ulong)poVar12);
                    local_1d8._0_1_ = (stringstream)0x5e;
                    poVar12 = std::__ostream_insert<char,std::char_traits<char>>
                                        (poVar12,(char *)&local_1d8,1);
                    peVar8 = (psVar11->
                             super___shared_ptr<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_(__gnu_cxx::_Lock_policy)2>
                             )._M_ptr;
                    poVar12 = std::__ostream_insert<char,std::char_traits<char>>
                                        (poVar12,(peVar8->second)._M_dataplus._M_p,
                                         (peVar8->second)._M_string_length);
                    local_1d8._0_1_ = (stringstream)0x3a;
                    poVar12 = std::__ostream_insert<char,std::char_traits<char>>
                                        (poVar12,(char *)&local_1d8,1);
                    psVar11 = local_248;
                    poVar12 = std::ostream::_M_insert<unsigned_long>((ulong)poVar12);
                    std::__ostream_insert<char,std::char_traits<char>>(poVar12,"(",1);
                    poVar12 = std::ostream::_M_insert<unsigned_long>((ulong)poVar12);
                    std::__ostream_insert<char,std::char_traits<char>>(poVar12,")",1);
                    local_1d8._0_1_ = (stringstream)0x3a;
                    std::__ostream_insert<char,std::char_traits<char>>(poVar12,(char *)&local_1d8,1)
                    ;
                    std::ostream::_M_insert<double>
                              ((double)*(float *)&(local_250->
                                                  super___shared_ptr<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_(__gnu_cxx::_Lock_policy)2>
                                                  )._M_ptr);
                    local_1d8 = CONCAT71(local_1d8._1_7_,0x3a);
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)&std::cout,(char *)&local_1d8,1);
                    pvVar21 = local_228;
                    p_Var19 = local_278;
                    if ((local_228->weights).sparse == true) {
                      local_280 = *(ulong *)psVar11 &
                                  (local_228->weights).sparse_weights._weight_mask;
                      _Var13._M_cur =
                           (__node_type *)
                           std::
                           _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_float_*>,_std::allocator<std::pair<const_unsigned_long,_float_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                           ::find(local_278,&local_280);
                      p_Var20 = local_260;
                      if (_Var13._M_cur == (__node_type *)0x0) {
                        local_1d0 = calloc_or_throw<float>
                                              (1L << ((byte)(pvVar21->weights).sparse_weights.
                                                            _stride_shift & 0x3f));
                        local_1d8 = local_280;
                        std::
                        _Hashtable<unsigned_long,std::pair<unsigned_long_const,float*>,std::allocator<std::pair<unsigned_long_const,float*>>,std::__detail::_Select1st,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                        ::_M_emplace<std::pair<unsigned_long,float*>>
                                  ((_Hashtable<unsigned_long,std::pair<unsigned_long_const,float*>,std::allocator<std::pair<unsigned_long_const,float*>>,std::__detail::_Select1st,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                                    *)p_Var19,&local_1d8);
                        _Var13._M_cur =
                             (__node_type *)
                             std::
                             _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_float_*>,_std::allocator<std::pair<const_unsigned_long,_float_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                             ::find(p_Var19,&local_280);
                        p_Var5 = (pvVar21->weights).sparse_weights.fun;
                        if (p_Var5 != (_func_void_weight_ptr_void_ptr *)0x0) {
                          (*p_Var5)(*(weight **)((long)_Var13._M_cur + 0x10),
                                    (pvVar21->weights).sparse_weights.default_data);
                        }
                      }
                      pwVar14 = *(weight **)
                                 ((long)&((_Var13._M_cur)->
                                         super__Hash_node_value<std::pair<const_unsigned_long,_float_*>,_false>
                                         ).
                                         super__Hash_node_value_base<std::pair<const_unsigned_long,_float_*>_>
                                         ._M_storage._M_storage + 8);
                    }
                    else {
                      pwVar14 = (local_228->weights).dense_weights._begin +
                                (*(ulong *)psVar11 & (local_228->weights).dense_weights._weight_mask
                                );
                      p_Var20 = local_260;
                    }
                    std::ostream::_M_insert<double>((double)pwVar14[(long)local_258]);
                    local_1d8._0_1_ = (stringstream)0x3a;
                    poVar12 = std::__ostream_insert<char,std::char_traits<char>>
                                        ((ostream *)&std::cout,(char *)&local_1d8,1);
                    psVar11 = local_1f0;
                    puVar2 = *(undefined8 **)
                              ((long)&(local_1f0->
                                      super___shared_ptr<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_(__gnu_cxx::_Lock_policy)2>
                                      )._M_ptr + (long)p_Var20 * 4);
                    poVar12 = std::__ostream_insert<char,std::char_traits<char>>
                                        (poVar12,(char *)*puVar2,puVar2[1]);
                    poVar12 = std::ostream::_M_insert<unsigned_long>((ulong)poVar12);
                    local_1d8._0_1_ = (stringstream)0x5e;
                    poVar12 = std::__ostream_insert<char,std::char_traits<char>>
                                        (poVar12,(char *)&local_1d8,1);
                    lVar17 = *(long *)((long)&(psVar11->
                                              super___shared_ptr<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_(__gnu_cxx::_Lock_policy)2>
                                              )._M_ptr + (long)p_Var20 * 4);
                    poVar12 = std::__ostream_insert<char,std::char_traits<char>>
                                        (poVar12,*(char **)(lVar17 + 0x20),*(long *)(lVar17 + 0x28))
                    ;
                    local_1d8._0_1_ = (stringstream)0x3a;
                    poVar12 = std::__ostream_insert<char,std::char_traits<char>>
                                        (poVar12,(char *)&local_1d8,1);
                    psVar11 = local_220;
                    poVar12 = std::ostream::_M_insert<unsigned_long>((ulong)poVar12);
                    std::__ostream_insert<char,std::char_traits<char>>(poVar12,"(",1);
                    p_Var20 = local_260;
                    poVar12 = std::ostream::_M_insert<unsigned_long>((ulong)poVar12);
                    std::__ostream_insert<char,std::char_traits<char>>(poVar12,")",1);
                    local_1d8._0_1_ = (stringstream)0x3a;
                    std::__ostream_insert<char,std::char_traits<char>>(poVar12,(char *)&local_1d8,1)
                    ;
                    pfVar7 = local_1e8;
                    std::ostream::_M_insert<double>
                              ((double)*(float *)((long)local_1e8 + (long)p_Var20));
                    local_1d8 = CONCAT71(local_1d8._1_7_,0x3a);
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)&std::cout,(char *)&local_1d8,1);
                    pvVar21 = local_228;
                    uVar4 = *(ulong *)((long)&(psVar11->
                                              super___shared_ptr<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_(__gnu_cxx::_Lock_policy)2>
                                              )._M_ptr + (long)p_Var20 * 2);
                    if ((local_228->weights).sparse == true) {
                      local_280 = uVar4 & (local_228->weights).sparse_weights._weight_mask;
                      _Var13._M_cur =
                           (__node_type *)
                           std::
                           _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_float_*>,_std::allocator<std::pair<const_unsigned_long,_float_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                           ::find(local_278,&local_280);
                      p_Var19 = local_258;
                      if (_Var13._M_cur == (__node_type *)0x0) {
                        local_1d0 = calloc_or_throw<float>
                                              (1L << ((byte)(pvVar21->weights).sparse_weights.
                                                            _stride_shift & 0x3f));
                        p_Var9 = local_278;
                        local_1d8 = local_280;
                        std::
                        _Hashtable<unsigned_long,std::pair<unsigned_long_const,float*>,std::allocator<std::pair<unsigned_long_const,float*>>,std::__detail::_Select1st,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                        ::_M_emplace<std::pair<unsigned_long,float*>>
                                  ((_Hashtable<unsigned_long,std::pair<unsigned_long_const,float*>,std::allocator<std::pair<unsigned_long_const,float*>>,std::__detail::_Select1st,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                                    *)local_278,&local_1d8);
                        _Var13._M_cur =
                             (__node_type *)
                             std::
                             _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_float_*>,_std::allocator<std::pair<const_unsigned_long,_float_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                             ::find(p_Var9,&local_280);
                        p_Var5 = (pvVar21->weights).sparse_weights.fun;
                        if (p_Var5 != (_func_void_weight_ptr_void_ptr *)0x0) {
                          (*p_Var5)(*(weight **)((long)_Var13._M_cur + 0x10),
                                    (pvVar21->weights).sparse_weights.default_data);
                        }
                      }
                      pwVar14 = *(weight **)
                                 ((long)&((_Var13._M_cur)->
                                         super__Hash_node_value<std::pair<const_unsigned_long,_float_*>,_false>
                                         ).
                                         super__Hash_node_value_base<std::pair<const_unsigned_long,_float_*>_>
                                         ._M_storage._M_storage + 8);
                    }
                    else {
                      pwVar14 = (local_228->weights).dense_weights._begin +
                                (uVar4 & (local_228->weights).dense_weights._weight_mask);
                      p_Var19 = local_258;
                    }
                    std::ostream::_M_insert<double>
                              ((double)pwVar14[(long)&(((weight_map *)&p_Var19->_M_buckets)->_M_h).
                                                      _M_buckets + (ulong)local_240->rank]);
                    local_1d8 = CONCAT71(local_1d8._1_7_,0x3a);
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)&std::cout,(char *)&local_1d8,1);
                    bVar15 = (pvVar21->weights).sparse;
                    if ((bool)bVar15 == true) {
                      local_280 = *(ulong *)local_248 &
                                  (pvVar21->weights).sparse_weights._weight_mask;
                      _Var13._M_cur =
                           (__node_type *)
                           std::
                           _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_float_*>,_std::allocator<std::pair<const_unsigned_long,_float_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                           ::find(local_278,&local_280);
                      if (_Var13._M_cur == (__node_type *)0x0) {
                        local_1d0 = calloc_or_throw<float>
                                              (1L << ((byte)(pvVar21->weights).sparse_weights.
                                                            _stride_shift & 0x3f));
                        p_Var9 = local_278;
                        local_1d8 = local_280;
                        std::
                        _Hashtable<unsigned_long,std::pair<unsigned_long_const,float*>,std::allocator<std::pair<unsigned_long_const,float*>>,std::__detail::_Select1st,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                        ::_M_emplace<std::pair<unsigned_long,float*>>
                                  ((_Hashtable<unsigned_long,std::pair<unsigned_long_const,float*>,std::allocator<std::pair<unsigned_long_const,float*>>,std::__detail::_Select1st,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                                    *)local_278,&local_1d8);
                        _Var13._M_cur =
                             (__node_type *)
                             std::
                             _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_float_*>,_std::allocator<std::pair<const_unsigned_long,_float_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                             ::find(p_Var9,&local_280);
                        p_Var5 = (pvVar21->weights).sparse_weights.fun;
                        if (p_Var5 != (_func_void_weight_ptr_void_ptr *)0x0) {
                          (*p_Var5)(*(weight **)((long)_Var13._M_cur + 0x10),
                                    (pvVar21->weights).sparse_weights.default_data);
                        }
                      }
                      pwVar14 = *(weight **)
                                 ((long)&((_Var13._M_cur)->
                                         super__Hash_node_value<std::pair<const_unsigned_long,_float_*>,_false>
                                         ).
                                         super__Hash_node_value_base<std::pair<const_unsigned_long,_float_*>_>
                                         ._M_storage._M_storage + 8);
                      bVar15 = (pvVar21->weights).sparse;
                    }
                    else {
                      pwVar14 = (pvVar21->weights).dense_weights._begin +
                                (*(ulong *)local_248 & (pvVar21->weights).dense_weights._weight_mask
                                );
                    }
                    wVar23 = pwVar14[(long)p_Var19];
                    uVar4 = *(ulong *)((long)&(local_220->
                                              super___shared_ptr<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_(__gnu_cxx::_Lock_policy)2>
                                              )._M_ptr + (long)p_Var20 * 2);
                    if ((bVar15 & 1) == 0) {
                      pwVar14 = (pvVar21->weights).dense_weights._begin +
                                (uVar4 & (pvVar21->weights).dense_weights._weight_mask);
                    }
                    else {
                      local_280 = uVar4 & (pvVar21->weights).sparse_weights._weight_mask;
                      local_20c = wVar23;
                      _Var13._M_cur =
                           (__node_type *)
                           std::
                           _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_float_*>,_std::allocator<std::pair<const_unsigned_long,_float_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                           ::find(local_278,&local_280);
                      if (_Var13._M_cur == (__node_type *)0x0) {
                        local_1d0 = calloc_or_throw<float>
                                              (1L << ((byte)(pvVar21->weights).sparse_weights.
                                                            _stride_shift & 0x3f));
                        p_Var9 = local_278;
                        local_1d8 = local_280;
                        std::
                        _Hashtable<unsigned_long,std::pair<unsigned_long_const,float*>,std::allocator<std::pair<unsigned_long_const,float*>>,std::__detail::_Select1st,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                        ::_M_emplace<std::pair<unsigned_long,float*>>
                                  ((_Hashtable<unsigned_long,std::pair<unsigned_long_const,float*>,std::allocator<std::pair<unsigned_long_const,float*>>,std::__detail::_Select1st,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                                    *)local_278,&local_1d8);
                        _Var13._M_cur =
                             (__node_type *)
                             std::
                             _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_float_*>,_std::allocator<std::pair<const_unsigned_long,_float_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                             ::find(p_Var9,&local_280);
                        p_Var5 = (pvVar21->weights).sparse_weights.fun;
                        if (p_Var5 != (_func_void_weight_ptr_void_ptr *)0x0) {
                          (*p_Var5)(*(weight **)((long)_Var13._M_cur + 0x10),
                                    (pvVar21->weights).sparse_weights.default_data);
                        }
                      }
                      pwVar14 = *(weight **)
                                 ((long)&((_Var13._M_cur)->
                                         super__Hash_node_value<std::pair<const_unsigned_long,_float_*>,_false>
                                         ).
                                         super__Hash_node_value_base<std::pair<const_unsigned_long,_float_*>_>
                                         ._M_storage._M_storage + 8);
                      wVar23 = local_20c;
                    }
                    std::ostream::_M_insert<double>
                              ((double)(wVar23 * pwVar14[(long)&(((weight_map *)&p_Var19->_M_buckets
                                                                 )->_M_h)._M_buckets +
                                                         (ulong)local_240->rank]));
                    p_Var19 = (_Hashtable<unsigned_long,_std::pair<const_unsigned_long,_float_*>,_std::allocator<std::pair<const_unsigned_long,_float_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                               *)((long)&p_Var20->_M_buckets + 4);
                  } while ((float *)((long)pfVar7 + (long)p_Var20 + 4) != local_1e0);
                }
                local_250 = (shared_ptr<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)((long)&(local_250->
                                       super___shared_ptr<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_(__gnu_cxx::_Lock_policy)2>
                                       )._M_ptr + 4);
                local_248 = (shared_ptr<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)((long)local_248 + 8);
                local_230 = local_230 + 1;
                pbVar18 = local_200;
              } while (local_250 != local_1f8);
              uVar10 = local_240->rank;
              offset = local_238;
              pvVar21 = local_228;
            }
            puVar1 = (unsigned_long *)((long)local_268 + 1);
            bVar22 = local_268 < (unsigned_long *)(ulong)uVar10;
            local_268 = puVar1;
          } while (bVar22);
        }
      }
      pbVar18 = pbVar18 + 1;
    } while (pbVar18 != local_208);
  }
  if ((pvVar21->triples).
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start ==
      (pvVar21->triples).
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x38);
    std::ostream::put(-0x38);
    std::ostream::flush();
    return;
  }
  std::__cxx11::stringstream::stringstream((stringstream *)&local_1d8);
  std::__ostream_insert<char,std::char_traits<char>>
            (&local_1c8,"cannot use triples in matrix factorization",0x2a);
  this = (vw_exception *)__cxa_allocate_exception(0x38);
  std::__cxx11::stringbuf::str();
  VW::vw_exception::vw_exception
            (this,
             "/workspace/llm4binary/github/license_all_cmakelists_25/kumpera[P]vowpal_wabbit/vowpalwabbit/gd_mf.cc"
             ,0x4c,&local_50);
  __cxa_throw(this,&VW::vw_exception::typeinfo,VW::vw_exception::~vw_exception);
}

Assistant:

void mf_print_offset_features(gdmf& d, example& ec, size_t offset)
{
  vw& all = *d.all;
  parameters& weights = all.weights;
  uint64_t mask = weights.mask();
  for (features& fs : ec)
  {
    bool audit = !fs.space_names.empty();
    for (auto& f : fs.values_indices_audit())
    {
      cout << '\t';
      if (audit)
        cout << f.audit().get()->first << '^' << f.audit().get()->second << ':';
      cout << f.index() << "(" << ((f.index() + offset) & mask) << ")" << ':' << f.value();
      cout << ':' << (&weights[f.index()])[offset];
    }
  }
  for (string& i : all.pairs)
    if (ec.feature_space[(unsigned char)i[0]].size() > 0 && ec.feature_space[(unsigned char)i[1]].size() > 0)
    {
      /* print out nsk^feature:hash:value:weight:nsk^feature^:hash:value:weight:prod_weights */
      for (size_t k = 1; k <= d.rank; k++)
      {
        for (features::iterator_all& f1 : ec.feature_space[(unsigned char)i[0]].values_indices_audit())
          for (features::iterator_all& f2 : ec.feature_space[(unsigned char)i[1]].values_indices_audit())
          {
            cout << '\t' << f1.audit().get()->first << k << '^' << f1.audit().get()->second << ':'
                 << ((f1.index() + k) & mask) << "(" << ((f1.index() + offset + k) & mask) << ")" << ':' << f1.value();
            cout << ':' << (&weights[f1.index()])[offset + k];

            cout << ':' << f2.audit().get()->first << k << '^' << f2.audit().get()->second << ':'
                 << ((f2.index() + k + d.rank) & mask) << "(" << ((f2.index() + offset + k + d.rank) & mask) << ")"
                 << ':' << f2.value();
            cout << ':' << (&weights[f2.index()])[offset + k + d.rank];

            cout << ':' << (&weights[f1.index()])[offset + k] * (&weights[f2.index()])[offset + k + d.rank];
          }
      }
    }
  if (all.triples.begin() != all.triples.end())
    THROW("cannot use triples in matrix factorization");
  cout << endl;
}